

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

string * __thiscall
inja::Environment::render
          (string *__return_storage_ptr__,Environment *this,string_view input,json *data)

{
  Template TStack_98;
  
  parse(&TStack_98,this,input);
  render(__return_storage_ptr__,this,&TStack_98,data);
  Template::~Template(&TStack_98);
  return __return_storage_ptr__;
}

Assistant:

std::string render(std::string_view input, const json& data) {
    return render(parse(input), data);
  }